

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

bool __thiscall
ImFontAtlas::GetMouseCursorTexData
          (ImFontAtlas *this,ImGuiMouseCursor cursor_type,ImVec2 *out_offset,ImVec2 *out_size,
          ImVec2 *out_uv_border,ImVec2 *out_uv_fill)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  uint uVar3;
  ImVec2 IVar4;
  float fVar5;
  ImFontAtlasCustomRect *pIVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  if (((uint)cursor_type < 9) && ((this->Flags & 2) == 0)) {
    IVar1 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][0];
    IVar4 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][2];
    IVar2 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][1];
    pIVar6 = (this->CustomRects).Data + this->PackIdMouseCursors;
    uVar3._0_2_ = pIVar6->X;
    uVar3._2_2_ = pIVar6->Y;
    *out_size = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][1];
    *out_offset = IVar4;
    auVar10 = vpmovzxwd_avx(ZEXT416(uVar3));
    auVar10 = vcvtdq2ps_avx(auVar10);
    auVar7._0_4_ = IVar1.x + auVar10._0_4_;
    auVar7._4_4_ = IVar1.y + auVar10._4_4_;
    auVar7._8_4_ = auVar10._8_4_ + 0.0;
    auVar7._12_4_ = auVar10._12_4_ + 0.0;
    auVar10._0_4_ = auVar7._0_4_ * (this->TexUvScale).x;
    auVar10._4_4_ = auVar7._4_4_ * (this->TexUvScale).y;
    auVar10._8_4_ = auVar7._8_4_ * 0.0;
    auVar10._12_4_ = auVar7._12_4_ * 0.0;
    IVar1 = (ImVec2)vmovlps_avx(auVar10);
    *out_uv_border = IVar1;
    fVar5 = IVar2.x;
    auVar11._0_4_ = auVar7._0_4_ + fVar5;
    auVar11._4_4_ = auVar7._4_4_ + IVar2.y;
    auVar11._8_4_ = auVar7._8_4_ + 0.0;
    auVar11._12_4_ = auVar7._12_4_ + 0.0;
    auVar12._0_4_ = auVar11._0_4_ * (this->TexUvScale).x;
    auVar12._4_4_ = auVar11._4_4_ * (this->TexUvScale).y;
    auVar12._8_4_ = auVar11._8_4_ * 0.0;
    auVar12._12_4_ = auVar11._12_4_ * 0.0;
    IVar1 = (ImVec2)vmovlps_avx(auVar12);
    out_uv_border[1] = IVar1;
    auVar10 = vblendps_avx(ZEXT416((uint)(auVar7._0_4_ + 123.0)),auVar7,2);
    auVar8._0_4_ = auVar10._0_4_ * (this->TexUvScale).x;
    auVar8._4_4_ = auVar10._4_4_ * (this->TexUvScale).y;
    auVar8._8_4_ = auVar10._8_4_ * 0.0;
    auVar8._12_4_ = auVar10._12_4_ * 0.0;
    IVar1 = (ImVec2)vmovlps_avx(auVar8);
    *out_uv_fill = IVar1;
    auVar10 = vblendps_avx(ZEXT416((uint)(auVar7._0_4_ + 123.0 + fVar5)),auVar11,2);
    auVar9._0_4_ = auVar10._0_4_ * (this->TexUvScale).x;
    auVar9._4_4_ = auVar10._4_4_ * (this->TexUvScale).y;
    auVar9._8_4_ = auVar10._8_4_ * 0.0;
    auVar9._12_4_ = auVar10._12_4_ * 0.0;
    IVar1 = (ImVec2)vmovlps_avx(auVar9);
    out_uv_fill[1] = IVar1;
    return true;
  }
  return false;
}

Assistant:

bool ImFontAtlas::GetMouseCursorTexData(ImGuiMouseCursor cursor_type, ImVec2* out_offset, ImVec2* out_size, ImVec2 out_uv_border[2], ImVec2 out_uv_fill[2])
{
    if (cursor_type <= ImGuiMouseCursor_None || cursor_type >= ImGuiMouseCursor_COUNT)
        return false;
    if (Flags & ImFontAtlasFlags_NoMouseCursors)
        return false;

    IM_ASSERT(PackIdMouseCursors != -1);
    ImFontAtlasCustomRect* r = GetCustomRectByIndex(PackIdMouseCursors);
    ImVec2 pos = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][0] + ImVec2((float)r->X, (float)r->Y);
    ImVec2 size = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][1];
    *out_size = size;
    *out_offset = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][2];
    out_uv_border[0] = (pos) * TexUvScale;
    out_uv_border[1] = (pos + size) * TexUvScale;
    pos.x += FONT_ATLAS_DEFAULT_TEX_DATA_W + 1;
    out_uv_fill[0] = (pos) * TexUvScale;
    out_uv_fill[1] = (pos + size) * TexUvScale;
    return true;
}